

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

void __thiscall IlmThread_2_5::ThreadPool::setNumThreads(ThreadPool *this,int count)

{
  __pointer_type pTVar1;
  int iVar2;
  long lVar3;
  DefaultThreadPoolProvider *this_00;
  ArgExc *this_01;
  Data *pDVar4;
  
  if (count < 0) {
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc
              (this_01,"Attempt to set the number of threads in a thread pool to a negative value.")
    ;
    __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pDVar4 = this->_data;
  LOCK();
  (pDVar4->provUsers).super___atomic_base<int>._M_i =
       (pDVar4->provUsers).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pTVar1 = (pDVar4->provider)._M_b._M_p;
  iVar2 = (*pTVar1->_vptr_ThreadPoolProvider[2])(pTVar1);
  if (iVar2 == count) goto LAB_00104a98;
  if (iVar2 == 0) {
    lVar3 = __dynamic_cast(pTVar1,&ThreadPoolProvider::typeinfo,
                           &(anonymous_namespace)::NullThreadPoolProvider::typeinfo,0);
    if (lVar3 != 0) {
      LOCK();
      (pDVar4->provUsers).super___atomic_base<int>._M_i =
           (pDVar4->provUsers).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (count != 0) {
        pDVar4 = this->_data;
        this_00 = (DefaultThreadPoolProvider *)operator_new(0xe0);
        anon_unknown_5::DefaultThreadPoolProvider::DefaultThreadPoolProvider(this_00,count);
        goto LAB_00104ac5;
      }
LAB_00104aa9:
      pDVar4 = this->_data;
      this_00 = (DefaultThreadPoolProvider *)operator_new(8);
      (this_00->super_ThreadPoolProvider)._vptr_ThreadPoolProvider =
           (_func_int **)&PTR__ThreadPoolProvider_00108c90;
LAB_00104ac5:
      Data::setProvider(pDVar4,&this_00->super_ThreadPoolProvider);
      return;
    }
  }
  else if (count == 0) {
    lVar3 = __dynamic_cast(pTVar1,&ThreadPoolProvider::typeinfo,
                           &(anonymous_namespace)::DefaultThreadPoolProvider::typeinfo,0);
    if (lVar3 != 0) {
      LOCK();
      (pDVar4->provUsers).super___atomic_base<int>._M_i =
           (pDVar4->provUsers).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      goto LAB_00104aa9;
    }
  }
  (*pTVar1->_vptr_ThreadPoolProvider[3])(pTVar1,count);
LAB_00104a98:
  LOCK();
  (pDVar4->provUsers).super___atomic_base<int>._M_i =
       (pDVar4->provUsers).super___atomic_base<int>._M_i + -1;
  UNLOCK();
  return;
}

Assistant:

void
ThreadPool::setNumThreads (int count)
{
    if (count < 0)
        throw IEX_INTERNAL_NAMESPACE::ArgExc ("Attempt to set the number of threads "
               "in a thread pool to a negative value.");

    bool doReset = false;
    {
        Data::SafeProvider sp = _data->getProvider ();
        int curT = sp->numThreads ();
        if ( curT == count )
            return;

        if ( curT == 0 )
        {
            NullThreadPoolProvider *npp = dynamic_cast<NullThreadPoolProvider *>( sp.get() );
            if ( npp )
                doReset = true;
        }
        else if ( count == 0 )
        {
            DefaultThreadPoolProvider *dpp = dynamic_cast<DefaultThreadPoolProvider *>( sp.get() );
            if ( dpp )
                doReset = true;
        }
        if ( ! doReset )
            sp->setNumThreads( count );
    }

    if ( doReset )
    {
        if ( count == 0 )
            _data->setProvider( new NullThreadPoolProvider );
        else
            _data->setProvider( new DefaultThreadPoolProvider( count ) );
    }
}